

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall deqp::gles31::Functional::anon_unknown_1::ClearCase::~ClearCase(ClearCase *this)

{
  ~ClearCase(this);
  operator_delete(this,0xe0);
  return;
}

Assistant:

ClearCase::~ClearCase (void)
{
	deinit();
}